

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3OsOpenMalloc(sqlite3_vfs *pVfs,char *zFile,sqlite3_file **ppFile,int flags,int *pOutFlags
                       )

{
  int iVar1;
  sqlite3_file *__s;
  int iVar2;
  
  iVar2 = pVfs->szOsFile;
  __s = (sqlite3_file *)sqlite3Malloc((long)iVar2);
  if (__s == (sqlite3_file *)0x0) {
    iVar2 = 7;
    __s = (sqlite3_file *)0x0;
  }
  else {
    memset(__s,0,(long)iVar2);
    iVar1 = (*pVfs->xOpen)(pVfs,zFile,__s,flags & 0x1087f7f,pOutFlags);
    iVar2 = 0;
    if (iVar1 != 0) {
      sqlite3_free(__s);
      __s = (sqlite3_file *)0x0;
      iVar2 = iVar1;
    }
  }
  *ppFile = __s;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsOpenMalloc(
  sqlite3_vfs *pVfs,
  const char *zFile,
  sqlite3_file **ppFile,
  int flags,
  int *pOutFlags
){
  int rc;
  sqlite3_file *pFile;
  pFile = (sqlite3_file *)sqlite3MallocZero(pVfs->szOsFile);
  if( pFile ){
    rc = sqlite3OsOpen(pVfs, zFile, pFile, flags, pOutFlags);
    if( rc!=SQLITE_OK ){
      sqlite3_free(pFile);
      *ppFile = 0;
    }else{
      *ppFile = pFile;
    }
  }else{
    *ppFile = 0;
    rc = SQLITE_NOMEM_BKPT;
  }
  assert( *ppFile!=0 || rc!=SQLITE_OK );
  return rc;
}